

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SCASerialization.h
# Opt level: O2

void __thiscall
Js::SerializationCloner<Js::StreamWriter>::WriteTypedArray<int,false,true>
          (SerializationCloner<Js::StreamWriter> *this,Src src)

{
  TypedArray<int,_false,_true> *pTVar1;
  Engine *this_00;
  
  Write(this,0x41);
  pTVar1 = VarTo<Js::TypedArray<int,false,true>>(src);
  this_00 = ClonerBase<void_*,_unsigned_int,_Js::TypeId,_Js::SerializationCloner<Js::StreamWriter>_>
            ::GetEngine(&this->
                         super_ClonerBase<void_*,_unsigned_int,_Js::TypeId,_Js::SerializationCloner<Js::StreamWriter>_>
                       );
  SCAEngine<void_*,_unsigned_int,_Js::SerializationCloner<Js::StreamWriter>_>::Clone
            (this_00,(pTVar1->super_TypedArrayBase).super_ArrayBufferParent.arrayBuffer.ptr);
  Write(this,(pTVar1->super_TypedArrayBase).byteOffset);
  Write(this,(pTVar1->super_TypedArrayBase).super_ArrayBufferParent.super_ArrayObject.length);
  return;
}

Assistant:

void WriteTypedArray(Src src) const
        {
            typedef TypedArrayTrace<T, clamped, isVirtual> trace_type;
            typedef typename trace_type::TypedArrayType array_type;

            WriteTypeId(trace_type::GetSCATypeId());
            array_type* arr = VarTo<array_type>(src);

            this->GetEngine()->Clone(arr->GetArrayBuffer());

            Write(arr->GetByteOffset());
            Write(arr->GetLength());
        }